

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

void anon_unknown.dwarf_12b4b87::ParseError(string *message,Token *token)

{
  runtime_error *this;
  string local_68;
  string local_48;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FBX-Parser","");
  Assimp::FBX::Util::AddTokenText(&local_48,&local_68,message,token);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  *(undefined ***)this = &PTR__runtime_error_008e3168;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void ParseError(const std::string& message, const Token& token)
    {
        throw DeadlyImportError(Util::AddTokenText("FBX-Parser",message,&token));
    }